

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

uint32 __thiscall Js::RecyclableObjectWalker::GetChildrenCount(RecyclableObjectWalker *this)

{
  code *pcVar1;
  RecyclableMethodsGroupWalker *pRVar2;
  TypeId typeId_00;
  bool bVar3;
  EnumeratorFlags EVar4;
  BOOL BVar5;
  int iVar6;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar7;
  undefined4 *puVar8;
  ScriptContext *this_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar9;
  RecyclableProxyObjectWalker *this_01;
  Var aValue;
  undefined4 extraout_var;
  JavascriptLibrary *this_02;
  RecyclableProtoObjectWalker *this_03;
  RecyclableArgumentsArrayWalker *this_04;
  JavascriptSet *this_05;
  JavascriptWeakMap *this_06;
  JavascriptWeakSet *this_07;
  JavascriptPromise *this_08;
  DynamicObject *this_09;
  RecyclableArrayWalker *pRVar10;
  DebugContext *this_10;
  HostDebugContext *pHVar11;
  int local_6c0;
  int local_6b8;
  Var local_5c0;
  RecyclableObject *local_520;
  uint32 childrenCount;
  HostDebugContext *hostDebugContext;
  TrackAllocData local_4f0;
  code *local_4c8;
  undefined8 local_4c0;
  TrackAllocData local_4b8;
  code *local_490;
  undefined8 local_488;
  TrackAllocData local_480;
  ArrayObject *local_458;
  ArrayObject *objectArray;
  DynamicObject *dynamicObject;
  code *local_440;
  undefined8 local_438;
  TrackAllocData local_430;
  DynamicObject *local_408;
  RecyclablePromiseObjectWalker *pPromiseWalker;
  JavascriptPromise *promise;
  code *local_3f0;
  undefined8 local_3e8;
  TrackAllocData local_3e0;
  JavascriptPromise *local_3b8;
  RecyclableWeakSetObjectWalker *pWeakSetWalker;
  JavascriptWeakSet *weakSet;
  code *local_3a0;
  undefined8 local_398;
  TrackAllocData local_390;
  JavascriptWeakSet *local_368;
  RecyclableWeakMapObjectWalker *pWeakMapWalker;
  JavascriptWeakMap *weakMap;
  code *local_350;
  undefined8 local_348;
  TrackAllocData local_340;
  JavascriptWeakMap *local_318;
  RecyclableSetObjectWalker *pSetWalker;
  JavascriptSet *set;
  code *local_300;
  undefined8 local_2f8;
  TrackAllocData local_2f0;
  JavascriptSet *local_2c8;
  RecyclableMapObjectWalker *pMapWalker;
  JavascriptMap *map;
  undefined8 local_2b0;
  TrackAllocData local_2a8;
  DynamicObject *local_280;
  ArgumentsObject *argObj;
  code *local_270;
  undefined8 local_268;
  TrackAllocData local_260;
  RecyclableProtoObjectWalker *local_238;
  RecyclableProtoObjectWalker *pProtoWalker_1;
  PropertyId propertyId_4;
  int i_2;
  PropertyId *specialEnumerablePropertyIds;
  bool isConst_1;
  JavascriptRegExpConstructor *pJStack_218;
  bool isUnscoped_2;
  JavascriptRegExpConstructor *regExp;
  PropertyId *local_208;
  anon_class_8_1_66460f8e local_200;
  anon_class_8_1_66460f8e containsPredicate;
  PropertyId local_1f0;
  bool isConst;
  int iStack_1ec;
  bool isUnscoped_1;
  PropertyId propertyId_3;
  int i_1;
  PropertyId *specialPropertyIds;
  int iStack_1d8;
  bool isUnscoped;
  PropertyId propertyId_2;
  int i;
  int count;
  RecyclableObject *wrapperObject;
  code *local_1c0;
  undefined8 local_1b8;
  TrackAllocData local_1b0;
  RecyclableObject *local_188;
  RecyclableProtoObjectWalker *pProtoWalker;
  code *local_178;
  undefined8 local_170;
  TrackAllocData local_168;
  RecyclableProxyObjectWalker *local_140;
  RecyclableProxyObjectWalker *proxyWalker;
  JavascriptProxy *proxy;
  PropertyId propertyId_1;
  Var error;
  JavascriptException *err;
  Var varValue;
  PropertyRecord *pPStack_108;
  uint32 indexVal;
  PropertyRecord *propertyRecord;
  JavascriptString *obj;
  undefined1 local_f0 [4];
  PropertyId propertyId;
  JavascriptStaticEnumerator enumerator;
  ScriptContext *objectContext;
  TypeId typeId;
  RecyclableObject *originalObject;
  RecyclableObject *object;
  RecyclableMethodsGroupWalker *pMethodsGroupWalker;
  ArenaAllocator *arena;
  RecyclableObjectWalker *this_local;
  TypeId local_58;
  TypeId local_54;
  RecyclableObject *pRStack_50;
  TypeId typeId_1;
  TypeId local_44;
  RecyclableObject *pRStack_40;
  TypeId typeId_5;
  TypeId local_34;
  RecyclableObject *pRStack_30;
  TypeId typeId_4;
  TypeId local_24;
  RecyclableObject *pRStack_20;
  TypeId typeId_3;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId_2;
  
  arena = (ArenaAllocator *)this;
  if (this->pMembersList !=
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) goto LAB_00c6b4a1;
  pMethodsGroupWalker = (RecyclableMethodsGroupWalker *)GetArenaFromContext(this->scriptContext);
  pLVar7 = JsUtil::
           List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::New((ArenaAllocator *)pMethodsGroupWalker,4);
  this->pMembersList = pLVar7;
  object = (RecyclableObject *)0x0;
  bVar3 = VarIs<Js::RecyclableObject>(this->instance);
  if (bVar3) {
    originalObject = VarTo<Js::RecyclableObject>(this->instance);
    local_520 = originalObject;
    if (this->originalInstance != (Var)0x0) {
      local_520 = VarTo<Js::RecyclableObject>(this->originalInstance);
    }
    this_local = (RecyclableObjectWalker *)this->instance;
    if (this_local == (RecyclableObjectWalker *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    bVar3 = TaggedInt::Is(this_local);
    if (bVar3) {
      local_58 = TypeIds_FirstNumberType;
    }
    else {
      bVar3 = JavascriptNumber::Is_NoTaggedIntCheck(this_local);
      if (bVar3) {
        local_58 = TypeIds_Number;
      }
      else {
        pRStack_50 = UnsafeVarTo<Js::RecyclableObject>(this_local);
        if (pRStack_50 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        local_54 = RecyclableObject::GetTypeId(pRStack_50);
        if ((0x57 < (int)local_54) && (BVar5 = RecyclableObject::IsExternal(pRStack_50), BVar5 == 0)
           ) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        local_58 = local_54;
      }
    }
    typeId_00 = local_58;
    BVar5 = Js::JavascriptOperators::IsObject(originalObject);
    if (BVar5 != 0) {
      BVar5 = RecyclableObject::IsExternal(originalObject);
      if (BVar5 == 0) {
        pRStack_10 = originalObject;
        if (originalObject == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        local_14 = RecyclableObject::GetTypeId(pRStack_10);
        if ((0x57 < (int)local_14) && (BVar5 = RecyclableObject::IsExternal(pRStack_10), BVar5 == 0)
           ) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        if (local_14 == TypeIds_Proxy) goto LAB_00c69c96;
        _i = (RecyclableObject *)0x0;
        pRStack_30 = originalObject;
        if (originalObject == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        local_34 = RecyclableObject::GetTypeId(pRStack_30);
        if ((0x57 < (int)local_34) && (BVar5 = RecyclableObject::IsExternal(pRStack_30), BVar5 == 0)
           ) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        if (local_34 == TypeIds_UnscopablesWrapperObject) {
          _i = originalObject;
          aValue = Js::JavascriptOperators::OP_UnwrapWithObj(originalObject);
          originalObject = UnsafeVarTo<Js::RecyclableObject>(aValue);
        }
        propertyId_2 = (*(originalObject->super_FinalizableObject).super_IRecyclerVisitedObject.
                         _vptr_IRecyclerVisitedObject[10])();
        for (iStack_1d8 = 0; iStack_1d8 < propertyId_2; iStack_1d8 = iStack_1d8 + 1) {
          specialPropertyIds._4_4_ =
               (*(originalObject->super_FinalizableObject).super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject[7])(originalObject,(ulong)(ushort)iStack_1d8);
          specialPropertyIds._3_1_ = 0;
          if ((_i != (RecyclableObject *)0x0) &&
             (BVar5 = Js::JavascriptOperators::IsPropertyUnscopable
                                (originalObject,specialPropertyIds._4_4_), BVar5 != 0)) {
            specialPropertyIds._3_1_ = 1;
          }
          if ((specialPropertyIds._4_4_ != -1) &&
             (BVar5 = IsInternalPropertyId(specialPropertyIds._4_4_), BVar5 == 0)) {
            InsertItem(this,local_520,originalObject,specialPropertyIds._4_4_,false,
                       (bool)(specialPropertyIds._3_1_ & 1),(RecyclableMethodsGroupWalker **)&object
                       ,false);
          }
        }
        if ((DAT_01ea9eeb & 1) != 0) {
          propertyId_2 = (*(originalObject->super_FinalizableObject).super_IRecyclerVisitedObject.
                           _vptr_IRecyclerVisitedObject[0x40])();
          iVar6 = (*(originalObject->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x41])();
          _propertyId_3 = CONCAT44(extraout_var,iVar6);
          for (iStack_1ec = 0; iStack_1ec < propertyId_2; iStack_1ec = iStack_1ec + 1) {
            local_1f0 = *(PropertyId *)(_propertyId_3 + (long)iStack_1ec * 4);
            containsPredicate.propertyId._7_1_ = 0;
            if ((_i != (RecyclableObject *)0x0) &&
               (BVar5 = Js::JavascriptOperators::IsPropertyUnscopable(originalObject,local_1f0),
               BVar5 != 0)) {
              containsPredicate.propertyId._7_1_ = 1;
            }
            if (local_1f0 != -1) {
              containsPredicate.propertyId._6_1_ = 1;
              if ((local_1f0 == 0xd1) &&
                 (bVar3 = Js::JavascriptArray::IsNonES5Array(originalObject), bVar3)) {
                containsPredicate.propertyId._6_1_ = 0;
              }
              local_200.propertyId = &local_1f0;
              bVar3 = VarIs<Js::BoundFunction,Js::RecyclableObject>(originalObject);
              if (bVar3) {
                local_208 = local_200.propertyId;
                bVar3 = JsUtil::
                        ReadOnlyList<Js::DebuggerPropertyDisplayInfo*,Memory::ArenaAllocator,DefaultComparer>
                        ::Any<Js::RecyclableObjectWalker::GetChildrenCount()::__0>
                                  ((ReadOnlyList<Js::DebuggerPropertyDisplayInfo*,Memory::ArenaAllocator,DefaultComparer>
                                    *)this->pMembersList,local_200);
                if (bVar3) goto LAB_00c6a7b6;
              }
              regExp = (JavascriptRegExpConstructor *)local_200.propertyId;
              bVar3 = JsUtil::
                      ReadOnlyList<Js::DebuggerPropertyDisplayInfo*,Memory::ArenaAllocator,DefaultComparer>
                      ::Any<Js::RecyclableObjectWalker::GetChildrenCount()::__0>
                                ((ReadOnlyList<Js::DebuggerPropertyDisplayInfo*,Memory::ArenaAllocator,DefaultComparer>
                                  *)this->pMembersList,local_200);
              if (bVar3) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar8 = 1;
                bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                            ,0x9ec,"(!this->pMembersList->Any(containsPredicate))",
                                            "Special property already on the object, no need to insert."
                                           );
                if (!bVar3) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar8 = 0;
              }
              InsertItem(this,local_520,originalObject,local_1f0,
                         (bool)(containsPredicate.propertyId._6_1_ & 1),
                         (bool)(containsPredicate.propertyId._7_1_ & 1),
                         (RecyclableMethodsGroupWalker **)&object,false);
            }
LAB_00c6a7b6:
          }
          bVar3 = VarIs<Js::JavascriptFunction,Js::RecyclableObject>(originalObject);
          if (bVar3) {
            this_02 = ScriptContext::GetLibrary(this->scriptContext);
            pJStack_218 = JavascriptLibraryBase::GetRegExpConstructor
                                    (&this_02->super_JavascriptLibraryBase);
            if (pJStack_218 == (JavascriptRegExpConstructor *)originalObject) {
              specialEnumerablePropertyIds._7_1_ = 0;
              specialEnumerablePropertyIds._6_1_ = 1;
              propertyId_2 = JavascriptRegExpConstructor::GetSpecialEnumerablePropertyCount
                                       (pJStack_218);
              _propertyId_4 =
                   JavascriptRegExpConstructor::GetSpecialEnumerablePropertyIds(pJStack_218);
              for (pProtoWalker_1._4_4_ = 0; pProtoWalker_1._4_4_ < propertyId_2;
                  pProtoWalker_1._4_4_ = pProtoWalker_1._4_4_ + 1) {
                pProtoWalker_1._0_4_ = _propertyId_4[pProtoWalker_1._4_4_];
                InsertItem(this,local_520,originalObject,(PropertyId)pProtoWalker_1,
                           (bool)(specialEnumerablePropertyIds._6_1_ & 1),
                           (bool)(specialEnumerablePropertyIds._7_1_ & 1),
                           (RecyclableMethodsGroupWalker **)&object,false);
              }
            }
          }
        }
        pRStack_40 = RecyclableObject::GetPrototype(originalObject);
        if (pRStack_40 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        local_44 = RecyclableObject::GetTypeId(pRStack_40);
        if ((0x57 < (int)local_44) && (BVar5 = RecyclableObject::IsExternal(pRStack_40), BVar5 == 0)
           ) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        if (local_44 != TypeIds_Null) {
          EnsureFakeGroupObjectWalkerList(this);
          pRVar2 = pMethodsGroupWalker;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_260,(type_info *)&RecyclableProtoObjectWalker::typeinfo,0,
                     0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                     ,0xa0e);
          pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                   *)pRVar2,&local_260);
          local_270 = Memory::ArenaAllocator::Alloc;
          local_268 = 0;
          this_03 = (RecyclableProtoObjectWalker *)
                    new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar9,0x3f67b0);
          RecyclableProtoObjectWalker::RecyclableProtoObjectWalker
                    (this_03,this->scriptContext,this->instance,this->originalInstance);
          argObj = (ArgumentsObject *)this_03;
          local_238 = this_03;
          JsUtil::
          List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(this->fakeGroupObjectWalkerList,(IDiagObjectModelWalkerBase **)&argObj);
        }
      }
      else {
LAB_00c69c96:
        this_00 = RecyclableObject::GetScriptContext(originalObject);
        JavascriptStaticEnumerator::JavascriptStaticEnumerator
                  ((JavascriptStaticEnumerator *)local_f0);
        EVar4 = operator|(EnumNonEnumerable,EnumSymbols);
        iVar6 = (*(originalObject->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x2b])
                          (originalObject,local_f0,(ulong)EVar4,this_00,0);
        if (iVar6 != 0) {
          while (propertyRecord =
                      (PropertyRecord *)
                      JavascriptStaticEnumerator::MoveAndGetNext
                                ((JavascriptStaticEnumerator *)local_f0,
                                 (PropertyId *)((long)&obj + 4),(PropertyAttributes *)0x0),
                (JavascriptString *)propertyRecord != (JavascriptString *)0x0) {
            if (obj._4_4_ == -1) {
              ScriptContext::GetOrAddPropertyRecord
                        (this_00,(JavascriptString *)propertyRecord,&stack0xfffffffffffffef8);
              obj._4_4_ = PropertyRecord::GetPropertyId(pPStack_108);
            }
            BVar5 = IsInternalPropertyId(obj._4_4_);
            if (BVar5 != 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                          ,0x987,"(!Js::IsInternalPropertyId(propertyId))",
                                          "!Js::IsInternalPropertyId(propertyId)");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 0;
            }
            BVar5 = ScriptContext::IsNumericPropertyId
                              (this_00,obj._4_4_,(uint32 *)((long)&varValue + 4));
            if ((BVar5 == 0) ||
               (BVar5 = RecyclableObject::GetItem
                                  (originalObject,originalObject,varValue._4_4_,&err,this_00),
               BVar5 == 0)) {
              InsertItem(this,local_520,originalObject,obj._4_4_,false,false,
                         (RecyclableMethodsGroupWalker **)&object,true);
            }
            else {
              InsertItem(this,obj._4_4_,false,false,err,(RecyclableMethodsGroupWalker **)&object,
                         true);
            }
          }
          propertyRecord = (PropertyRecord *)0x0;
        }
        if (typeId_00 == TypeIds_Proxy) {
          EnsureFakeGroupObjectWalkerList(this);
          proxyWalker = (RecyclableProxyObjectWalker *)
                        VarTo<Js::JavascriptProxy,Js::RecyclableObject>(originalObject);
          pRVar2 = pMethodsGroupWalker;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_168,(type_info *)&RecyclableProxyObjectWalker::typeinfo,0,
                     0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                     ,0x9a6);
          pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                   *)pRVar2,&local_168);
          local_178 = Memory::ArenaAllocator::Alloc;
          local_170 = 0;
          this_01 = (RecyclableProxyObjectWalker *)
                    new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar9,0x3f67b0);
          RecyclableProxyObjectWalker::RecyclableProxyObjectWalker
                    (this_01,this->scriptContext,proxyWalker);
          pProtoWalker = (RecyclableProtoObjectWalker *)this_01;
          local_140 = this_01;
          JsUtil::
          List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(this->fakeGroupObjectWalkerList,(IDiagObjectModelWalkerBase **)&pProtoWalker);
        }
        pRStack_20 = RecyclableObject::GetPrototype(originalObject);
        if (pRStack_20 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        local_24 = RecyclableObject::GetTypeId(pRStack_20);
        if ((0x57 < (int)local_24) && (BVar5 = RecyclableObject::IsExternal(pRStack_20), BVar5 == 0)
           ) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        if (local_24 != TypeIds_Null) {
          EnsureFakeGroupObjectWalkerList(this);
          pRVar2 = pMethodsGroupWalker;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_1b0,(type_info *)&RecyclableProtoObjectWalker::typeinfo,0,
                     0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                     ,0x9af);
          pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                   *)pRVar2,&local_1b0);
          local_1c0 = Memory::ArenaAllocator::Alloc;
          local_1b8 = 0;
          wrapperObject =
               (RecyclableObject *)
               new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar9,0x3f67b0);
          if (this->originalInstance == (Var)0x0) {
            local_5c0 = this->instance;
          }
          else {
            local_5c0 = this->originalInstance;
          }
          RecyclableProtoObjectWalker::RecyclableProtoObjectWalker
                    ((RecyclableProtoObjectWalker *)wrapperObject,this->scriptContext,this->instance
                     ,local_5c0);
          local_188 = wrapperObject;
          JsUtil::
          List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(this->fakeGroupObjectWalkerList,(IDiagObjectModelWalkerBase **)&wrapperObject);
        }
      }
      if (typeId_00 == TypeIds_Arguments) {
        local_280 = (DynamicObject *)this->instance;
        if (local_280 == (DynamicObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                      ,0xa19,"(argObj)","argObj");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        iVar6 = (*(local_280->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6b])();
        if ((iVar6 != 0) || (bVar3 = DynamicObject::HasNonEmptyObjectArray(local_280), bVar3)) {
          pRVar2 = pMethodsGroupWalker;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_2a8,(type_info *)&RecyclableArgumentsArrayWalker::typeinfo,0,
                     0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                     ,0xa1d);
          pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                   *)pRVar2,&local_2a8);
          map = (JavascriptMap *)Memory::ArenaAllocator::Alloc;
          local_2b0 = 0;
          this_04 = (RecyclableArgumentsArrayWalker *)
                    new<Memory::ArenaAllocator>(0x58,(ArenaAllocator *)pAVar9,0x3f67b0);
          RecyclableArgumentsArrayWalker::RecyclableArgumentsArrayWalker
                    (this_04,this->scriptContext,this->instance,this->originalInstance);
          this->innerArrayObjectWalker = (RecyclableArrayWalker *)this_04;
        }
      }
      else if (typeId_00 == TypeIds_Map) {
        EnsureFakeGroupObjectWalkerList(this);
        pMapWalker = (RecyclableMapObjectWalker *)
                     VarTo<Js::JavascriptMap,Js::RecyclableObject>(originalObject);
        pRVar2 = pMethodsGroupWalker;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_2f0,
                   (type_info *)&RecyclableCollectionObjectWalker<Js::JavascriptMap>::typeinfo,0,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                   ,0xa26);
        pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 *)pRVar2,&local_2f0);
        local_300 = Memory::ArenaAllocator::Alloc;
        local_2f8 = 0;
        this_05 = (JavascriptSet *)
                  new<Memory::ArenaAllocator>(0x20,(ArenaAllocator *)pAVar9,0x3f67b0);
        RecyclableCollectionObjectWalker<Js::JavascriptMap>::RecyclableCollectionObjectWalker
                  ((RecyclableCollectionObjectWalker<Js::JavascriptMap> *)this_05,
                   this->scriptContext,pMapWalker);
        set = this_05;
        local_2c8 = this_05;
        JsUtil::
        List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add(this->fakeGroupObjectWalkerList,(IDiagObjectModelWalkerBase **)&set);
      }
      else if (typeId_00 == TypeIds_Set) {
        EnsureFakeGroupObjectWalkerList(this);
        pSetWalker = (RecyclableSetObjectWalker *)
                     VarTo<Js::JavascriptSet,Js::RecyclableObject>(originalObject);
        pRVar2 = pMethodsGroupWalker;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_340,
                   (type_info *)&RecyclableCollectionObjectWalker<Js::JavascriptSet>::typeinfo,0,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                   ,0xa2f);
        pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 *)pRVar2,&local_340);
        local_350 = Memory::ArenaAllocator::Alloc;
        local_348 = 0;
        this_06 = (JavascriptWeakMap *)
                  new<Memory::ArenaAllocator>(0x20,(ArenaAllocator *)pAVar9,0x3f67b0);
        RecyclableCollectionObjectWalker<Js::JavascriptSet>::RecyclableCollectionObjectWalker
                  ((RecyclableCollectionObjectWalker<Js::JavascriptSet> *)this_06,
                   this->scriptContext,pSetWalker);
        weakMap = this_06;
        local_318 = this_06;
        JsUtil::
        List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add(this->fakeGroupObjectWalkerList,(IDiagObjectModelWalkerBase **)&weakMap);
      }
      else if (typeId_00 == TypeIds_WeakMap) {
        EnsureFakeGroupObjectWalkerList(this);
        pWeakMapWalker =
             (RecyclableWeakMapObjectWalker *)
             VarTo<Js::JavascriptWeakMap,Js::RecyclableObject>(originalObject);
        pRVar2 = pMethodsGroupWalker;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_390,
                   (type_info *)&RecyclableCollectionObjectWalker<Js::JavascriptWeakMap>::typeinfo,0
                   ,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                   ,0xa38);
        pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 *)pRVar2,&local_390);
        local_3a0 = Memory::ArenaAllocator::Alloc;
        local_398 = 0;
        this_07 = (JavascriptWeakSet *)
                  new<Memory::ArenaAllocator>(0x20,(ArenaAllocator *)pAVar9,0x3f67b0);
        RecyclableCollectionObjectWalker<Js::JavascriptWeakMap>::RecyclableCollectionObjectWalker
                  ((RecyclableCollectionObjectWalker<Js::JavascriptWeakMap> *)this_07,
                   this->scriptContext,pWeakMapWalker);
        weakSet = this_07;
        local_368 = this_07;
        JsUtil::
        List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add(this->fakeGroupObjectWalkerList,(IDiagObjectModelWalkerBase **)&weakSet);
      }
      else if (typeId_00 == TypeIds_WeakSet) {
        EnsureFakeGroupObjectWalkerList(this);
        pWeakSetWalker =
             (RecyclableWeakSetObjectWalker *)
             VarTo<Js::JavascriptWeakSet,Js::RecyclableObject>(originalObject);
        pRVar2 = pMethodsGroupWalker;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_3e0,
                   (type_info *)&RecyclableCollectionObjectWalker<Js::JavascriptWeakSet>::typeinfo,0
                   ,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                   ,0xa41);
        pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 *)pRVar2,&local_3e0);
        local_3f0 = Memory::ArenaAllocator::Alloc;
        local_3e8 = 0;
        this_08 = (JavascriptPromise *)
                  new<Memory::ArenaAllocator>(0x20,(ArenaAllocator *)pAVar9,0x3f67b0);
        RecyclableCollectionObjectWalker<Js::JavascriptWeakSet>::RecyclableCollectionObjectWalker
                  ((RecyclableCollectionObjectWalker<Js::JavascriptWeakSet> *)this_08,
                   this->scriptContext,pWeakSetWalker);
        promise = this_08;
        local_3b8 = this_08;
        JsUtil::
        List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add(this->fakeGroupObjectWalkerList,(IDiagObjectModelWalkerBase **)&promise);
      }
      else if (typeId_00 == TypeIds_Promise) {
        EnsureFakeGroupObjectWalkerList(this);
        pPromiseWalker =
             (RecyclablePromiseObjectWalker *)
             VarTo<Js::JavascriptPromise,Js::RecyclableObject>(originalObject);
        pRVar2 = pMethodsGroupWalker;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_430,(type_info *)&RecyclablePromiseObjectWalker::typeinfo,0,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                   ,0xa4a);
        pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 *)pRVar2,&local_430);
        local_440 = Memory::ArenaAllocator::Alloc;
        local_438 = 0;
        this_09 = (DynamicObject *)
                  new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar9,0x3f67b0);
        RecyclablePromiseObjectWalker::RecyclablePromiseObjectWalker
                  ((RecyclablePromiseObjectWalker *)this_09,this->scriptContext,pPromiseWalker);
        dynamicObject = this_09;
        local_408 = this_09;
        JsUtil::
        List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add(this->fakeGroupObjectWalkerList,(IDiagObjectModelWalkerBase **)&dynamicObject);
      }
      else {
        bVar3 = DynamicType::Is(typeId_00);
        if (bVar3) {
          objectArray = (ArrayObject *)VarTo<Js::DynamicObject>(this->instance);
          bVar3 = DynamicObject::HasNonEmptyObjectArray((DynamicObject *)objectArray);
          if (bVar3) {
            local_458 = DynamicObject::GetObjectArray(&objectArray->super_DynamicObject);
            bVar3 = VarIs<Js::ES5Array,Js::ArrayObject>(local_458);
            pRVar2 = pMethodsGroupWalker;
            if (bVar3) {
              Memory::TrackAllocData::CreateTrackAllocData
                        (&local_480,(type_info *)&RecyclableES5ArrayWalker::typeinfo,0,
                         0xffffffffffffffff,
                         "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                         ,0xa55);
              pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                       TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                       *)pRVar2,&local_480);
              local_490 = Memory::ArenaAllocator::Alloc;
              local_488 = 0;
              pRVar10 = (RecyclableArrayWalker *)
                        new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar9,0x3f67b0);
              RecyclableES5ArrayWalker::RecyclableES5ArrayWalker
                        ((RecyclableES5ArrayWalker *)pRVar10,this->scriptContext,local_458,
                         this->originalInstance);
              this->innerArrayObjectWalker = pRVar10;
            }
            else {
              bVar3 = Js::JavascriptArray::IsNonES5Array(local_458);
              pRVar2 = pMethodsGroupWalker;
              if (bVar3) {
                Memory::TrackAllocData::CreateTrackAllocData
                          (&local_4b8,(type_info *)&RecyclableArrayWalker::typeinfo,0,
                           0xffffffffffffffff,
                           "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                           ,0xa59);
                pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                         ::TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                           *)pRVar2,&local_4b8);
                local_4c8 = Memory::ArenaAllocator::Alloc;
                local_4c0 = 0;
                pRVar10 = (RecyclableArrayWalker *)
                          new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar9,0x3f67b0);
                RecyclableArrayWalker::RecyclableArrayWalker
                          (pRVar10,this->scriptContext,local_458,this->originalInstance);
                this->innerArrayObjectWalker = pRVar10;
              }
              else {
                Memory::TrackAllocData::CreateTrackAllocData
                          (&local_4f0,(type_info *)&RecyclableTypedArrayWalker::typeinfo,0,
                           0xffffffffffffffff,
                           "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                           ,0xa5d);
                pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                         ::TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                           *)pRVar2,&local_4f0);
                pRVar10 = (RecyclableArrayWalker *)
                          new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar9,0x3f67b0);
                RecyclableTypedArrayWalker::RecyclableTypedArrayWalker
                          ((RecyclableTypedArrayWalker *)pRVar10,this->scriptContext,local_458,
                           this->originalInstance);
                this->innerArrayObjectWalker = pRVar10;
              }
            }
            RecyclableArrayWalker::SetOnlyWalkOwnProperties(this->innerArrayObjectWalker,true);
          }
        }
      }
    }
  }
  if (object != (RecyclableObject *)0x0) {
    RecyclableMethodsGroupWalker::Sort((RecyclableMethodsGroupWalker *)object);
  }
  this_10 = ScriptContext::GetDebugContext(this->scriptContext);
  pHVar11 = DebugContext::GetHostDebugContext(this_10);
  if (pHVar11 != (HostDebugContext *)0x0) {
    (*pHVar11->_vptr_HostDebugContext[5])(pHVar11,this->pMembersList,this->scriptContext);
  }
LAB_00c6b4a1:
  iVar6 = JsUtil::
          ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>::
          Count(&this->pMembersList->
                 super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
               );
  if (this->innerArrayObjectWalker == (RecyclableArrayWalker *)0x0) {
    local_6b8 = 0;
  }
  else {
    local_6b8 = (*(this->innerArrayObjectWalker->super_RecyclableObjectWalker).
                  super_IDiagObjectModelWalkerBase._vptr_IDiagObjectModelWalkerBase[1])();
  }
  if (this->fakeGroupObjectWalkerList ==
      (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    local_6c0 = 0;
  }
  else {
    local_6c0 = JsUtil::
                ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                ::Count(&this->fakeGroupObjectWalkerList->
                         super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                       );
  }
  return iVar6 + local_6b8 + local_6c0;
}

Assistant:

uint32 RecyclableObjectWalker::GetChildrenCount()
    {
        if (pMembersList == nullptr)
        {
            ArenaAllocator *arena = GetArenaFromContext(scriptContext);

            pMembersList = JsUtil::List<DebuggerPropertyDisplayInfo *, ArenaAllocator>::New(arena);

            RecyclableMethodsGroupWalker *pMethodsGroupWalker = nullptr;

            if (Js::VarIs<Js::RecyclableObject>(instance))
            {
                Js::RecyclableObject* object = Js::VarTo<Js::RecyclableObject>(instance);
                // If we are walking a prototype, we'll use its instance for property names enumeration, but originalInstance to get values
                Js::RecyclableObject* originalObject = (originalInstance != nullptr) ? Js::VarTo<Js::RecyclableObject>(originalInstance) : object;
                const Js::TypeId typeId = JavascriptOperators::GetTypeId(instance);

                if (JavascriptOperators::IsObject(object))
                {
                    if (object->IsExternal() || JavascriptOperators::GetTypeId(object) == TypeIds_Proxy)
                    {
                        try
                        {
                            ScriptContext * objectContext = object->GetScriptContext();
                            JavascriptStaticEnumerator enumerator;
                            if (object->GetEnumerator(&enumerator, EnumeratorFlags::EnumNonEnumerable | EnumeratorFlags::EnumSymbols, objectContext))
                            {
                                Js::PropertyId propertyId;
                                JavascriptString * obj;

                                while ((obj = enumerator.MoveAndGetNext(propertyId)) != nullptr)
                                {
                                    if (propertyId == Constants::NoProperty)
                                    {
                                        const PropertyRecord* propertyRecord;
                                        objectContext->GetOrAddPropertyRecord(obj, &propertyRecord);
                                        propertyId = propertyRecord->GetPropertyId();
                                    }
                                    // MoveAndGetNext shouldn't return an internal property id
                                    Assert(!Js::IsInternalPropertyId(propertyId));

                                    uint32 indexVal;
                                    Var varValue;
                                    if (objectContext->IsNumericPropertyId(propertyId, &indexVal) && object->GetItem(object, indexVal, &varValue, objectContext))
                                    {
                                        InsertItem(propertyId, false /*isConst*/, false /*isUnscoped*/, varValue, &pMethodsGroupWalker, true /*shouldPinProperty*/);
                                    }
                                    else
                                    {
                                        InsertItem(originalObject, object, propertyId, false /*isConst*/, false /*isUnscoped*/, &pMethodsGroupWalker, true /*shouldPinProperty*/);
                                    }
                                }
                            }
                        }
                        catch (const JavascriptException& err)
                        {
                            Var error = err.GetAndClear()->GetThrownObject(scriptContext);
                            if (error != nullptr && Js::VarIs<Js::JavascriptError>(error))
                            {
                                Js::PropertyId propertyId = scriptContext->GetOrAddPropertyIdTracked(_u("{error}"));
                                InsertItem(propertyId, false /*isConst*/, false /*isUnscoped*/, error, &pMethodsGroupWalker);
                            }
                        }

                        if (typeId == TypeIds_Proxy)
                        {
                            // Provide [Proxy] group object
                            EnsureFakeGroupObjectWalkerList();

                            JavascriptProxy* proxy = VarTo<JavascriptProxy>(object);
                            RecyclableProxyObjectWalker* proxyWalker = Anew(arena, RecyclableProxyObjectWalker, scriptContext, proxy);
                            fakeGroupObjectWalkerList->Add(proxyWalker);
                        }
                        // If current object has internal proto object then provide [prototype] group object.
                        if (JavascriptOperators::GetTypeId(object->GetPrototype()) != TypeIds_Null)
                        {
                            // Has [prototype] object.
                            EnsureFakeGroupObjectWalkerList();

                            RecyclableProtoObjectWalker *pProtoWalker = Anew(arena, RecyclableProtoObjectWalker, scriptContext, instance, (originalInstance == nullptr) ? instance : originalInstance);
                            fakeGroupObjectWalkerList->Add(pProtoWalker);
                        }
                    }
                    else
                    {
                        RecyclableObject* wrapperObject = nullptr;
                        if (JavascriptOperators::GetTypeId(object) == TypeIds_UnscopablesWrapperObject)
                        {
                            wrapperObject = object;
                            object = Js::UnsafeVarTo<Js::RecyclableObject>(JavascriptOperators::OP_UnwrapWithObj(wrapperObject));
                        }

                        int count = object->GetPropertyCount();

                        for (int i = 0; i < count; i++)
                        {
                            Js::PropertyId propertyId = object->GetPropertyId((PropertyIndex)i);
                            bool isUnscoped = false;
                            if (wrapperObject && JavascriptOperators::IsPropertyUnscopable(object, propertyId))
                            {
                                isUnscoped = true;
                            }
                            if (propertyId != Js::Constants::NoProperty && !Js::IsInternalPropertyId(propertyId))
                            {
                                InsertItem(originalObject, object, propertyId, false /*isConst*/, isUnscoped, &pMethodsGroupWalker);
                            }
                        }

                        if (CONFIG_FLAG(EnumerateSpecialPropertiesInDebugger))
                        {
                            count = object->GetSpecialPropertyCount();
                            PropertyId const * specialPropertyIds = object->GetSpecialPropertyIds();
                            for (int i = 0; i < count; i++)
                            {
                                Js::PropertyId propertyId = specialPropertyIds[i];
                                bool isUnscoped = false;
                                if (wrapperObject && JavascriptOperators::IsPropertyUnscopable(object, propertyId))
                                {
                                    isUnscoped = true;
                                }
                                if (propertyId != Js::Constants::NoProperty)
                                {
                                    bool isConst = true;
                                    if (propertyId == PropertyIds::length && Js::JavascriptArray::IsNonES5Array(object))
                                    {
                                        // For JavascriptArrays, we allow resetting the length special property.
                                        isConst = false;
                                    }

                                    auto containsPredicate = [&](Js::DebuggerPropertyDisplayInfo* info) { return info->propId == propertyId; };
                                    if (Js::VarIs<Js::BoundFunction>(object)
                                        && this->pMembersList->Any(containsPredicate))
                                    {
                                        // Bound functions can already contain their special properties,
                                        // so we need to check for that (caller and arguments).  This occurs
                                        // when JavascriptFunction::EntryBind() is called.  Arguments can similarly
                                        // already display caller in compat mode 8.
                                        continue;
                                    }

                                    AssertMsg(!this->pMembersList->Any(containsPredicate), "Special property already on the object, no need to insert.");

                                    InsertItem(originalObject, object, propertyId, isConst, isUnscoped, &pMethodsGroupWalker);
                                }
                            }
                            if (Js::VarIs<Js::JavascriptFunction>(object))
                            {
                                // We need to special-case RegExp constructor here because it has some special properties (above) and some
                                // special enumerable properties which should all show up in the debugger.
                                JavascriptRegExpConstructor* regExp = scriptContext->GetLibrary()->GetRegExpConstructor();

                                if (regExp == object)
                                {
                                    bool isUnscoped = false;
                                    bool isConst = true;
                                    count = regExp->GetSpecialEnumerablePropertyCount();
                                    PropertyId const * specialEnumerablePropertyIds = regExp->GetSpecialEnumerablePropertyIds();

                                    for (int i = 0; i < count; i++)
                                    {
                                        Js::PropertyId propertyId = specialEnumerablePropertyIds[i];

                                        InsertItem(originalObject, object, propertyId, isConst, isUnscoped, &pMethodsGroupWalker);
                                    }
                                }
                            }
                        }

                        // If current object has internal proto object then provide [prototype] group object.
                        if (JavascriptOperators::GetTypeId(object->GetPrototype()) != TypeIds_Null)
                        {
                            // Has [prototype] object.
                            EnsureFakeGroupObjectWalkerList();

                            RecyclableProtoObjectWalker *pProtoWalker = Anew(arena, RecyclableProtoObjectWalker, scriptContext, instance, originalInstance);
                            fakeGroupObjectWalkerList->Add(pProtoWalker);
                        }
                    }

                    // If the object contains array indices.
                    if (typeId == TypeIds_Arguments)
                    {
                        // Create ArgumentsArray walker for an arguments object

                        Js::ArgumentsObject * argObj = static_cast<Js::ArgumentsObject*>(instance);
                        Assert(argObj);

                        if (argObj->GetNumberOfArguments() > 0 || argObj->HasNonEmptyObjectArray())
                        {
                            innerArrayObjectWalker = Anew(arena, RecyclableArgumentsArrayWalker, scriptContext, (Var)instance, originalInstance);
                        }
                    }
                    else if (typeId == TypeIds_Map)
                    {
                        // Provide [Map] group object.
                        EnsureFakeGroupObjectWalkerList();

                        JavascriptMap* map = VarTo<JavascriptMap>(object);
                        RecyclableMapObjectWalker *pMapWalker = Anew(arena, RecyclableMapObjectWalker, scriptContext, map);
                        fakeGroupObjectWalkerList->Add(pMapWalker);
                    }
                    else if (typeId == TypeIds_Set)
                    {
                        // Provide [Set] group object.
                        EnsureFakeGroupObjectWalkerList();

                        JavascriptSet* set = VarTo<JavascriptSet>(object);
                        RecyclableSetObjectWalker *pSetWalker = Anew(arena, RecyclableSetObjectWalker, scriptContext, set);
                        fakeGroupObjectWalkerList->Add(pSetWalker);
                    }
                    else if (typeId == TypeIds_WeakMap)
                    {
                        // Provide [WeakMap] group object.
                        EnsureFakeGroupObjectWalkerList();

                        JavascriptWeakMap* weakMap = VarTo<JavascriptWeakMap>(object);
                        RecyclableWeakMapObjectWalker *pWeakMapWalker = Anew(arena, RecyclableWeakMapObjectWalker, scriptContext, weakMap);
                        fakeGroupObjectWalkerList->Add(pWeakMapWalker);
                    }
                    else if (typeId == TypeIds_WeakSet)
                    {
                        // Provide [WeakSet] group object.
                        EnsureFakeGroupObjectWalkerList();

                        JavascriptWeakSet* weakSet = VarTo<JavascriptWeakSet>(object);
                        RecyclableWeakSetObjectWalker *pWeakSetWalker = Anew(arena, RecyclableWeakSetObjectWalker, scriptContext, weakSet);
                        fakeGroupObjectWalkerList->Add(pWeakSetWalker);
                    }
                    else if (typeId == TypeIds_Promise)
                    {
                        // Provide [Promise] group object.
                        EnsureFakeGroupObjectWalkerList();

                        JavascriptPromise* promise = VarTo<JavascriptPromise>(object);
                        RecyclablePromiseObjectWalker *pPromiseWalker = Anew(arena, RecyclablePromiseObjectWalker, scriptContext, promise);
                        fakeGroupObjectWalkerList->Add(pPromiseWalker);
                    }
                    else if (Js::DynamicType::Is(typeId))
                    {
                        DynamicObject *const dynamicObject = Js::VarTo<Js::DynamicObject>(instance);
                        if (dynamicObject->HasNonEmptyObjectArray())
                        {
                            ArrayObject* objectArray = dynamicObject->GetObjectArray();
                            if (Js::VarIs<Js::ES5Array>(objectArray))
                            {
                                innerArrayObjectWalker = Anew(arena, RecyclableES5ArrayWalker, scriptContext, objectArray, originalInstance);
                            }
                            else if (Js::JavascriptArray::IsNonES5Array(objectArray))
                            {
                                innerArrayObjectWalker = Anew(arena, RecyclableArrayWalker, scriptContext, objectArray, originalInstance);
                            }
                            else
                            {
                                innerArrayObjectWalker = Anew(arena, RecyclableTypedArrayWalker, scriptContext, objectArray, originalInstance);
                            }

                            innerArrayObjectWalker->SetOnlyWalkOwnProperties(true);
                        }
                    }
                }
            }
            // Sort the members of the methods group
            if (pMethodsGroupWalker)
            {
                pMethodsGroupWalker->Sort();
            }

            // Sort current pMembersList.
            HostDebugContext* hostDebugContext = scriptContext->GetDebugContext()->GetHostDebugContext();
            if (hostDebugContext != nullptr)
            {
                hostDebugContext->SortMembersList(pMembersList, scriptContext);
            }
        }

        uint32 childrenCount =
            pMembersList->Count()
          + (innerArrayObjectWalker ? innerArrayObjectWalker->GetChildrenCount() : 0)
          + (fakeGroupObjectWalkerList ? fakeGroupObjectWalkerList->Count() : 0);

        return childrenCount;
    }